

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniFlagConvertFailure_Test::TestBody(TApp_IniFlagConvertFailure_Test *this)

{
  bool bVar1;
  string *psVar2;
  ostream *this_00;
  AssertHelper local_350;
  Message local_348 [2];
  ConversionError *anon_var_0;
  char *pcStack_330;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ofstream out;
  allocator local_121;
  string local_120;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  TempFile tmpini;
  TApp_IniFlagConvertFailure_Test *this_local;
  
  tmpini._name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"TestIniTmp.ini",&local_51);
  TempFile::TempFile((TempFile *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"--flag",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
  CLI::App::add_flag(&(this->super_TApp).app,&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"--config",&local_d9);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::__cxx11::string::string((string *)&local_100,(string *)psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Read an ini file",&local_121);
  CLI::App::set_config(&(this->super_TApp).app,&local_d8,&local_100,&local_120,false);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::ofstream::ofstream(&gtest_msg,psVar2,0x10);
  this_00 = std::operator<<((ostream *)&gtest_msg,"flag=moobook");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffcd0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffcd0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0011eb42;
    pcStack_330 = 
    "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_348);
  testing::internal::AssertHelper::AssertHelper
            (&local_350,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0x1cc,pcStack_330);
  testing::internal::AssertHelper::operator=(&local_350,local_348);
  testing::internal::AssertHelper::~AssertHelper(&local_350);
  testing::Message::~Message(local_348);
LAB_0011eb42:
  TempFile::~TempFile((TempFile *)local_30);
  return;
}

Assistant:

TEST_F(TApp, IniFlagConvertFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.add_flag("--flag");
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "flag=moobook" << std::endl;
    }

    EXPECT_THROW(run(), CLI::ConversionError);
}